

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

timestamp_t
duckdb::DateTrunc::
UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::YearOperator>
          (timestamp_t input)

{
  bool bVar1;
  date_t input_00;
  timestamp_t tVar2;
  undefined1 auVar3 [16];
  timestamp_t result;
  timestamp_t local_40;
  string local_38;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    input_00.days = duckdb::Timestamp::GetDate(input);
    tVar2 = YearOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input_00);
    return (timestamp_t)tVar2.value;
  }
  bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input,&local_40,false)
  ;
  if (bVar1) {
    return (timestamp_t)local_40.value;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
            (&local_38,(duckdb *)input.value,(timestamp_t)auVar3._8_8_);
  duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_38);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}